

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

void * sx_os_dlsym(void *handle,char *symbol)

{
  void *pvVar1;
  
  pvVar1 = (void *)dlsym();
  return pvVar1;
}

Assistant:

void* sx_os_dlsym(void* handle, const char* symbol)
{
#if SX_PLATFORM_WINDOWS
    return (void*)GetProcAddress((HMODULE)handle, symbol);
#elif SX_PLATFORM_EMSCRIPTEN || SX_PLATFORM_PS4 || SX_PLATFORM_XBOXONE
    sx_unused(handle);
    sx_unused(symbol);
    return NULL;
#else
    return dlsym(handle, symbol);
#endif
}